

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase321::run(TestCase321 *this)

{
  Builder builder;
  bool bVar1;
  uint uVar2;
  LowLevelAsyncIoProvider *pLVar3;
  RefOrVoid<kj::AsyncOutputStream> output_00;
  Iterator IVar4;
  undefined8 in_stack_fffffffffffffd40;
  Promise<void> local_290;
  Type local_280;
  Function<void_()> local_270;
  undefined1 local_260 [8];
  Thread thread;
  undefined1 auStack_220 [8];
  Builder element;
  undefined1 local_1e8 [8];
  Iterator __end2;
  undefined1 local_1c8 [8];
  Iterator __begin2;
  Builder *__range2;
  Builder list;
  Builder root;
  TestMessageBuilder message;
  Own<kj::AsyncOutputStream> output;
  undefined1 local_48 [8];
  AsyncIoContext ioContext;
  PipeWithSmallBuffer fds;
  TestCase321 *this_local;
  
  PipeWithSmallBuffer::PipeWithSmallBuffer((PipeWithSmallBuffer *)&ioContext.unixEventPort);
  kj::setupAsyncIo();
  pLVar3 = kj::Own<kj::LowLevelAsyncIoProvider>::operator->
                     ((Own<kj::LowLevelAsyncIoProvider> *)local_48);
  uVar2 = PipeWithSmallBuffer::operator[]((PipeWithSmallBuffer *)&ioContext.unixEventPort,1);
  (*pLVar3->_vptr_LowLevelAsyncIoProvider[1])(&message.desiredSegmentCount,pLVar3,(ulong)uVar2,0);
  TestMessageBuilder::TestMessageBuilder((TestMessageBuilder *)&root._builder.dataSize,10);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)&list.builder.structDataSize,(MessageBuilder *)&root._builder.dataSize);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructList
            ((Builder *)&__range2,(Builder *)&list.builder.structDataSize,0x10);
  __begin2._8_8_ = &__range2;
  IVar4 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::begin
                    ((Builder *)__begin2._8_8_);
  __end2._8_8_ = IVar4.container;
  __begin2.container._0_4_ = IVar4.index;
  local_1c8 = (undefined1  [8])__end2._8_8_;
  IVar4 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::end
                    ((Builder *)__begin2._8_8_);
  element._builder._32_8_ = IVar4.container;
  __end2.container._0_4_ = IVar4.index;
  local_1e8 = (undefined1  [8])element._builder._32_8_;
  while( true ) {
    bVar1 = IndexingIterator<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder,_capnproto_test::capnp::test::TestAllTypes::Builder>
            ::operator!=((IndexingIterator<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder,_capnproto_test::capnp::test::TestAllTypes::Builder>
                          *)local_1c8,
                         (IndexingIterator<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder,_capnproto_test::capnp::test::TestAllTypes::Builder>
                          *)local_1e8);
    if (!bVar1) break;
    IndexingIterator<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder,_capnproto_test::capnp::test::TestAllTypes::Builder>
    ::operator*((Builder *)auStack_220,
                (IndexingIterator<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder,_capnproto_test::capnp::test::TestAllTypes::Builder>
                 *)local_1c8);
    thread._16_8_ = auStack_220;
    builder._builder.capTable = element._builder.capTable;
    builder._builder.segment = element._builder.segment;
    builder._builder.data = element._builder.data;
    builder._builder.pointers = element._builder.pointers;
    builder._builder.dataSize = (int)in_stack_fffffffffffffd40;
    builder._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffd40 >> 0x20);
    builder._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffd40 >> 0x30);
    initTestMessage(builder);
    IndexingIterator<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder,_capnproto_test::capnp::test::TestAllTypes::Builder>
    ::operator++((IndexingIterator<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder,_capnproto_test::capnp::test::TestAllTypes::Builder>
                  *)local_1c8);
  }
  local_280.fds = (PipeWithSmallBuffer *)&ioContext.unixEventPort;
  local_280.list = (Builder *)&__range2;
  kj::Function<void()>::Function<capnp::_::(anonymous_namespace)::TestCase321::run()::__0>
            ((Function<void()> *)&local_270,&local_280);
  kj::Thread::Thread((Thread *)local_260,&local_270);
  kj::Function<void_()>::~Function(&local_270);
  output_00 = kj::Own<kj::AsyncOutputStream>::operator*
                        ((Own<kj::AsyncOutputStream> *)&message.desiredSegmentCount);
  writeMessage((capnp *)&local_290,output_00,(MessageBuilder *)&root._builder.dataSize);
  kj::Promise<void>::wait(&local_290,ioContext.provider.ptr);
  kj::Promise<void>::~Promise(&local_290);
  kj::Thread::~Thread((Thread *)local_260);
  TestMessageBuilder::~TestMessageBuilder((TestMessageBuilder *)&root._builder.dataSize);
  kj::Own<kj::AsyncOutputStream>::~Own((Own<kj::AsyncOutputStream> *)&message.desiredSegmentCount);
  kj::AsyncIoContext::~AsyncIoContext((AsyncIoContext *)local_48);
  PipeWithSmallBuffer::~PipeWithSmallBuffer((PipeWithSmallBuffer *)&ioContext.unixEventPort);
  return;
}

Assistant:

TEST(Schema, Generics) {
  StructSchema allTypes = Schema::from<TestAllTypes>();
  StructSchema tap = Schema::from<test::TestAnyPointer>();
  StructSchema schema = Schema::from<test::TestUseGenerics>();

  StructSchema branded;

  {
    StructSchema::Field basic = schema.getFieldByName("basic");
    branded = basic.getType().asStruct();

    StructSchema::Field foo = branded.getFieldByName("foo");
    EXPECT_TRUE(foo.getType().asStruct() == allTypes);
    EXPECT_TRUE(foo.getType().asStruct() != tap);

    StructSchema instance2 = branded.getFieldByName("rev").getType().asStruct();
    StructSchema::Field foo2 = instance2.getFieldByName("foo");
    EXPECT_TRUE(foo2.getType().asStruct() == tap);
    EXPECT_TRUE(foo2.getType().asStruct() != allTypes);
  }

  {
    StructSchema inner2 = schema.getFieldByName("inner2").getType().asStruct();

    StructSchema bound = inner2.getFieldByName("innerBound").getType().asStruct();
    Type boundFoo = bound.getFieldByName("foo").getType();
    EXPECT_FALSE(boundFoo.isAnyPointer());
    EXPECT_TRUE(boundFoo.asStruct() == allTypes);

    StructSchema unbound = inner2.getFieldByName("innerUnbound").getType().asStruct();
    Type unboundFoo = unbound.getFieldByName("foo").getType();
    EXPECT_TRUE(unboundFoo.isAnyPointer());
  }

  {
    InterfaceSchema cap = schema.getFieldByName("genericCap").getType().asInterface();
    InterfaceSchema::Method method = cap.getMethodByName("call");

    StructSchema inner2 = method.getParamType();
    StructSchema bound = inner2.getFieldByName("innerBound").getType().asStruct();
    Type boundFoo = bound.getFieldByName("foo").getType();
    EXPECT_FALSE(boundFoo.isAnyPointer());
    EXPECT_TRUE(boundFoo.asStruct() == allTypes);
    EXPECT_TRUE(inner2.getFieldByName("baz").getType().isText());

    StructSchema results = method.getResultType();
    EXPECT_TRUE(results.getFieldByName("qux").getType().isData());

    EXPECT_TRUE(results.getFieldByName("gen").getType().asStruct() == branded);
  }
}